

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O0

void __thiscall ArithmeticEncoder::writeBits(ArithmeticEncoder *this,U32 bits,U32 sym)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint local_18;
  U32 init_base;
  U32 sym_local;
  U32 bits_local;
  ArithmeticEncoder *this_local;
  
  bVar3 = false;
  if ((bits != 0) && (bVar3 = false, bits < 0x21)) {
    bVar3 = sym < (uint)(1 << ((byte)bits & 0x1f));
  }
  if (!bVar3) {
    __assert_fail("bits && (bits <= 32) && (sym < (1u<<bits))",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                  ,0x103,"void ArithmeticEncoder::writeBits(U32, U32)");
  }
  local_18 = sym;
  init_base = bits;
  if (0x13 < bits) {
    writeShort(this,(U16)sym);
    local_18 = sym >> 0x10;
    init_base = bits - 0x10;
  }
  uVar1 = this->base;
  uVar2 = this->length >> ((byte)init_base & 0x1f);
  this->length = uVar2;
  this->base = local_18 * uVar2 + this->base;
  if (this->base < uVar1) {
    propagate_carry(this);
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
  }
  return;
}

Assistant:

void ArithmeticEncoder::writeBits(U32 bits, U32 sym)
{
  assert(bits && (bits <= 32) && (sym < (1u<<bits)));

  if (bits > 19)
  {
    writeShort(sym&U16_MAX);
    sym = sym >> 16;
    bits = bits - 16;
  }

  U32 init_base = base;
  base += sym * (length >>= bits);             // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}